

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  float fVar2;
  int width;
  int height;
  int depth;
  TextureFormat TVar3;
  TextureFormat TVar4;
  ulong uVar5;
  int i;
  TextureChannelClass TVar6;
  long lVar7;
  InternalError *this;
  ulong uVar8;
  ConstPixelBufferAccess *pCVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  ChannelOrder __fd;
  _Alloc_hider _Var10;
  int y;
  int z;
  int z_00;
  bool bVar11;
  uint uVar12;
  float fVar13;
  Vector<float,_4> res;
  Vec4 pixelScale;
  Vec4 diff;
  Vec4 cmpPix;
  Vec4 refPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  ConstPixelBufferAccess *local_4c0;
  LogImageSet local_4b8;
  Vec4 local_478;
  Vec4 local_460;
  string local_450;
  string local_430;
  char *local_410;
  char *local_408;
  TextureFormat local_400;
  Vector<float,_4> local_3f8;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  LogImage local_328;
  LogImage local_290;
  undefined1 local_200 [32];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [264];
  ConstPixelBufferAccess local_80;
  TextureLevel local_58;
  
  width = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_INT8;
  local_4c0 = reference;
  local_408 = imageSetName;
  TextureLevel::TextureLevel(&local_58,(TextureFormat *)local_200,width,height,depth);
  TextureLevel::getAccess((PixelBufferAccess *)&local_80,&local_58);
  local_3f8.m_data._0_8_ = (pointer)0x0;
  local_3f8.m_data[2] = 0.0;
  local_3f8.m_data[3] = 0.0;
  local_478.m_data[0] = 0.0;
  local_478.m_data[1] = 0.0;
  local_478.m_data[2] = 0.0;
  local_478.m_data[3] = 0.0;
  local_460.m_data[0] = 1.0;
  local_460.m_data[1] = 1.0;
  local_460.m_data[2] = 1.0;
  local_460.m_data[3] = 1.0;
  local_410 = imageSetDesc;
  local_400 = (TextureFormat)log;
  if ((((result->m_size).m_data[0] != width) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != depth)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x249);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  if (0 < depth) {
    z = 0;
    do {
      if (0 < height) {
        z_00 = 0;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_200,(int)local_4c0,y,z_00);
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&local_290,(int)result,y,z_00);
              local_4b8.m_name._M_dataplus._M_p = (pointer)0x0;
              local_4b8.m_name._M_string_length = 0;
              lVar7 = 0;
              do {
                *(float *)((long)&local_4b8.m_name._M_dataplus._M_p + lVar7 * 4) =
                     *(float *)(local_200 + lVar7 * 4) -
                     *(float *)((long)(&local_290.m_access.m_size + -6) + lVar7 * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              local_328.m_name._M_dataplus._M_p = (pointer)0x0;
              local_328.m_name._M_string_length = 0;
              lVar7 = 0;
              do {
                fVar2 = *(float *)((long)&local_4b8.m_name._M_dataplus._M_p + lVar7 * 4);
                fVar13 = -fVar2;
                if (-fVar2 <= fVar2) {
                  fVar13 = fVar2;
                }
                *(float *)((long)(&local_328.m_access.m_size + -6) + lVar7 * 4) = fVar13;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              local_4b8.m_name._M_dataplus._M_p =
                   local_4b8.m_name._M_dataplus._M_p & 0xffffffff00000000;
              lVar7 = 0;
              do {
                *(bool *)((long)&local_4b8.m_name._M_dataplus._M_p + lVar7) =
                     *(float *)((long)(&local_328.m_access.m_size + -6) + lVar7 * 4) <=
                     threshold->m_data[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              if ((char)local_4b8.m_name._M_dataplus._M_p == '\0') {
                bVar11 = false;
              }
              else {
                uVar5 = 0;
                do {
                  uVar8 = uVar5;
                  if (uVar8 == 3) break;
                  uVar5 = uVar8 + 1;
                } while (*(char *)((long)&local_4b8.m_name._M_dataplus._M_p + uVar8 + 1) != '\0');
                bVar11 = 2 < uVar8;
              }
              local_4b8.m_name._M_dataplus._M_p = (pointer)0x0;
              local_4b8.m_name._M_string_length = 0;
              lVar7 = 0;
              do {
                fVar2 = *(float *)((long)(&local_328.m_access.m_size + -6) + lVar7 * 4);
                uVar12 = -(uint)(fVar2 <= local_3f8.m_data[lVar7]);
                *(uint *)((long)&local_4b8.m_name._M_dataplus._M_p + lVar7 * 4) =
                     ~uVar12 & (uint)fVar2 | (uint)local_3f8.m_data[lVar7] & uVar12;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              local_3f8.m_data._0_8_ = local_4b8.m_name._M_dataplus._M_p;
              local_3f8.m_data[2] = (float)(undefined4)local_4b8.m_name._M_string_length;
              local_3f8.m_data[3] = (float)local_4b8.m_name._M_string_length._4_4_;
              if (bVar11) {
                local_4b8.m_name._M_dataplus._M_p = (char *)0x3f80000000000000;
              }
              else {
                local_4b8.m_name._M_dataplus._M_p = (char *)0x3f800000;
              }
              local_4b8.m_name._M_string_length = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_80,(Vec4 *)&local_4b8,y,z_00,z);
              y = y + 1;
            } while (y != width);
          }
          z_00 = z_00 + 1;
        } while (z_00 != height);
      }
      z = z + 1;
    } while (z != depth);
  }
  TVar3 = local_400;
  local_200._0_8_ = local_200._0_8_ & 0xffffffff00000000;
  lVar7 = 0;
  do {
    local_200[lVar7] = local_3f8.m_data[lVar7] <= threshold->m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (local_200[0] == R) {
    bVar11 = false;
  }
  else {
    uVar5 = 0;
    do {
      uVar8 = uVar5;
      if (uVar8 == 3) break;
      uVar5 = uVar8 + 1;
    } while (local_200[uVar8 + 1] != '\0');
    bVar11 = 2 < uVar8;
  }
  __fd = local_400.order;
  if ((bool)(logMode != COMPARE_LOG_EVERYTHING & bVar11)) {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00aa19a2;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_460,&local_478);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,local_408,(allocator<char> *)&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,local_410,(allocator<char> *)&local_3c8);
    LogImageSet::LogImageSet((LogImageSet *)&local_290,&local_328.m_name,&local_4b8.m_name);
    TestLog::startImageSet
              ((TestLog *)TVar3,local_290.m_name._M_dataplus._M_p,
               local_290.m_description._M_dataplus._M_p);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Result","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_430,&local_450,result,&local_460,&local_478,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,__fd,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200._0_8_ != (long)local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
      operator_delete(local_290.m_description._M_dataplus._M_p,
                      local_290.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
      operator_delete(local_290.m_name._M_dataplus._M_p,
                      local_290.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8.m_name._M_dataplus._M_p != &local_4b8.m_name.field_2) {
      operator_delete(local_4b8.m_name._M_dataplus._M_p,
                      local_4b8.m_name.field_2._M_allocated_capacity + 1);
    }
    local_430.field_2._M_allocated_capacity = local_328.m_name.field_2._M_allocated_capacity;
    _Var10._M_p = local_328.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p == &local_328.m_name.field_2) goto LAB_00aa19a2;
  }
  else {
    TVar6 = getTextureChannelClass((local_4c0->m_format).type);
    if ((TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar6 = getTextureChannelClass((result->m_format).type),
       TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(local_4c0,result,&local_460,&local_478);
      TVar4 = local_400;
      poVar1 = (ostringstream *)(local_200 + 8);
      local_400.order = TVar3.order;
      local_400.type = TVar3.type;
      local_200._0_4_ = local_400.order;
      local_200._4_4_ = local_400.type;
      local_400 = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Result and reference images are normalized with formula p * ",
                 0x3c);
      operator<<((ostream *)poVar1,&local_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," + ",3);
      operator<<((ostream *)poVar1,&local_478);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    TVar4 = local_400;
    if (!bVar11) {
      poVar1 = (ostringstream *)(local_200 + 8);
      local_400.order = TVar3.order;
      local_400.type = TVar3.type;
      local_200._0_4_ = local_400.order;
      local_200._4_4_ = local_400.type;
      local_400 = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)poVar1,&local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", threshold = ",0xe);
      operator<<((ostream *)poVar1,threshold);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,local_408,&local_4c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,local_410,&local_4c2);
    LogImageSet::LogImageSet(&local_4b8,&local_430,&local_450);
    TestLog::startImageSet
              ((TestLog *)TVar3,local_4b8.m_name._M_dataplus._M_p,
               local_4b8.m_description._M_dataplus._M_p);
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_3e8,&local_3c8,result,&local_460,&local_478,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,__fd,__buf_00,(size_t)result);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Reference","");
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Reference","");
    pCVar9 = local_4c0;
    LogImage::LogImage(&local_290,&local_348,&local_368,local_4c0,&local_460,&local_478,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_290,__fd,__buf_01,(size_t)pCVar9);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ErrorMask","");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Error mask","");
    pCVar9 = &local_80;
    LogImage::LogImage(&local_328,&local_388,&local_3a8,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
    TVar3 = local_400;
    LogImage::write(&local_328,local_400.order,__buf_02,(size_t)pCVar9);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
      operator_delete(local_328.m_description._M_dataplus._M_p,
                      local_328.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
      operator_delete(local_328.m_name._M_dataplus._M_p,
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
      operator_delete(local_290.m_description._M_dataplus._M_p,
                      local_290.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
      operator_delete(local_290.m_name._M_dataplus._M_p,
                      local_290.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200._0_8_ != (long)local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8.m_description._M_dataplus._M_p != &local_4b8.m_description.field_2) {
      operator_delete(local_4b8.m_description._M_dataplus._M_p,
                      local_4b8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8.m_name._M_dataplus._M_p != &local_4b8.m_name.field_2) {
      operator_delete(local_4b8.m_name._M_dataplus._M_p,
                      local_4b8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    _Var10._M_p = local_430._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p == &local_430.field_2) goto LAB_00aa19a2;
  }
  operator_delete(_Var10._M_p,local_430.field_2._M_allocated_capacity + 1);
LAB_00aa19a2:
  TextureLevel::~TextureLevel(&local_58);
  return bVar11;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				Vec4	refPix		= reference.getPixel(x, y, z);
				Vec4	cmpPix		= result.getPixel(x, y, z);

				Vec4	diff		= abs(refPix - cmpPix);
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}